

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visitStringConst
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,StringConst *curr
          )

{
  string local_50;
  Literal local_30;
  
  IString::toString_abi_cxx11_(&local_50,&(curr->string).super_IString);
  Literal::Literal(&local_30,&local_50);
  Flow::Flow(__return_storage_ptr__,&local_30);
  Literal::~Literal(&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

Flow visitStringConst(StringConst* curr) {
    return Literal(curr->string.toString());
  }